

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permissions.cpp
# Opt level: O0

string * fs_get_permissions_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view path_00;
  bool bVar1;
  _Bool _Var2;
  perms pVar3;
  perms pVar4;
  undefined1 *puVar5;
  perms others_exec;
  perms others_write;
  perms others_read;
  perms group_exec;
  perms group_write;
  perms group_read;
  perms owner_exec;
  perms owner_write;
  perms owner_read;
  perms none;
  perms p;
  size_t local_a8;
  char *pcStack_a0;
  path local_98;
  undefined8 local_70;
  file_status s;
  error_code ec;
  allocator<char> local_41;
  string local_40 [8];
  string r;
  string_view path_local;
  
  r.field_2._8_8_ = path._M_len;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"---------",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::error_code::error_code((error_code *)&s);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_98,(basic_string_view<char,_std::char_traits<char>_> *)((long)&r.field_2 + 8),
             auto_format);
  local_70 = std::filesystem::status(&local_98,(error_code *)&s);
  std::filesystem::__cxx11::path::~path(&local_98);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&s);
  if (bVar1) {
    local_a8 = r.field_2._8_8_;
    pcStack_a0 = path._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&p,"fs_get_permissions");
    path_00._M_str = pcStack_a0;
    path_00._M_len = local_a8;
    fs_print_error(path_00,_p,(error_code *)&s);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pVar3 = std::filesystem::file_status::permissions((file_status *)&local_70);
    pVar4 = std::filesystem::operator&(pVar3,owner_read);
    if (pVar4 != none) {
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
      *puVar5 = 0x72;
    }
    pVar4 = std::filesystem::operator&(pVar3,owner_write);
    if (pVar4 != none) {
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
      *puVar5 = 0x77;
    }
    pVar4 = std::filesystem::operator&(pVar3,owner_exec);
    if (pVar4 != none) {
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
      *puVar5 = 0x78;
    }
    _Var2 = fs_is_windows();
    if (!_Var2) {
      pVar4 = std::filesystem::operator&(pVar3,group_read);
      if (pVar4 != none) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
        *puVar5 = 0x72;
      }
      pVar4 = std::filesystem::operator&(pVar3,group_write);
      if (pVar4 != none) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
        *puVar5 = 0x77;
      }
      pVar4 = std::filesystem::operator&(pVar3,group_exec);
      if (pVar4 != none) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
        *puVar5 = 0x78;
      }
      pVar4 = std::filesystem::operator&(pVar3,others_read);
      if (pVar4 != none) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
        *puVar5 = 0x72;
      }
      pVar4 = std::filesystem::operator&(pVar3,others_write);
      if (pVar4 != none) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
        *puVar5 = 0x77;
      }
      pVar3 = std::filesystem::operator&(pVar3,others_exec);
      if (pVar3 != none) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
        *puVar5 = 0x78;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  }
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_get_permissions(std::string_view path)
{

  std::string r = "---------";

#ifdef HAVE_CXX_FILESYSTEM
  std::error_code ec;
  const auto s = std::filesystem::status(path, ec);
  if(ec)  FFS_UNLIKELY
  {
    fs_print_error(path, __func__, ec);
    return {};
  }

  const std::filesystem::perms p = s.permissions();

#if defined(__cpp_using_enum)  // C++20
  using enum std::filesystem::perms;
#else
  constexpr std::filesystem::perms none = std::filesystem::perms::none;
  constexpr std::filesystem::perms owner_read = std::filesystem::perms::owner_read;
  constexpr std::filesystem::perms owner_write = std::filesystem::perms::owner_write;
  constexpr std::filesystem::perms owner_exec = std::filesystem::perms::owner_exec;
  constexpr std::filesystem::perms group_read = std::filesystem::perms::group_read;
  constexpr std::filesystem::perms group_write = std::filesystem::perms::group_write;
  constexpr std::filesystem::perms group_exec = std::filesystem::perms::group_exec;
  constexpr std::filesystem::perms others_read = std::filesystem::perms::others_read;
  constexpr std::filesystem::perms others_write = std::filesystem::perms::others_write;
  constexpr std::filesystem::perms others_exec = std::filesystem::perms::others_exec;
#endif

  if ((p & owner_read) != none)
    r[0] = 'r';
  if ((p & owner_write) != none)
    r[1] = 'w';
  if ((p & owner_exec) != none)
    r[2] = 'x';

  if(!fs_is_windows()){

  if ((p & group_read) != none)
    r[3] = 'r';
  if ((p & group_write) != none)
    r[4] = 'w';
  if ((p & group_exec) != none)
    r[5] = 'x';
  if ((p & others_read) != none)
    r[6] = 'r';
  if ((p & others_write) != none)
    r[7] = 'w';
  if ((p & others_exec) != none)
    r[8] = 'x';

  }

#else

  const int m = fs_st_mode(path);
  if(m == 0) FFS_UNLIKELY
  {
    fs_print_error(path, __func__);
    return {};
  }

#if defined(_MSC_VER)
  if (m & _S_IREAD)
    r[0] = 'r';
  if (m & _S_IWRITE)
    r[1] = 'w';
  if (m & _S_IEXEC)
    r[2] = 'x';
#else
  if (m & S_IRUSR)
    r[0] = 'r';
  if (m & S_IWUSR)
    r[1] = 'w';
  if (m & S_IXUSR)
    r[2] = 'x';
#endif

#if !defined(_WIN32)
  if (m & S_IRGRP)
    r[3] = 'r';
  if (m & S_IWGRP)
    r[4] = 'w';
  if (m & S_IXGRP)
    r[5] = 'x';
  if (m & S_IROTH)
    r[6] = 'r';
  if (m & S_IWOTH)
    r[7] = 'w';
  if (m & S_IXOTH)
    r[8] = 'x';
#endif

#endif

  return r;
}